

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

RegOpnd * __thiscall
Lowerer::LoadObjectArray(Lowerer *this,RegOpnd *baseOpnd,Instr *insertBeforeInstr)

{
  Func *func_00;
  code *pcVar1;
  Instr *baseOpnd_00;
  bool bVar2;
  bool bVar3;
  IRType type;
  ObjectType OVar4;
  DWORD offset;
  undefined4 *puVar5;
  ArrayRegOpnd *this_00;
  Opnd *this_01;
  StackSym *pSVar6;
  IndirOpnd *src;
  RegOpnd *local_70;
  undefined1 local_58 [8];
  AutoReuseOpnd autoReuseArrayOpnd;
  RegOpnd *arrayOpnd;
  Func *func;
  Instr *local_20;
  Instr *insertBeforeInstr_local;
  RegOpnd *baseOpnd_local;
  Lowerer *this_local;
  
  local_20 = insertBeforeInstr;
  insertBeforeInstr_local = (Instr *)baseOpnd;
  baseOpnd_local = (RegOpnd *)this;
  if (baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3baf,"(baseOpnd)","baseOpnd");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  func._6_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType((Opnd *)insertBeforeInstr_local);
  bVar3 = ValueType::IsLikelyObject((ValueType *)((long)&func + 6));
  bVar2 = false;
  if (bVar3) {
    func._4_2_ = (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 IR::Opnd::GetValueType((Opnd *)insertBeforeInstr_local);
    OVar4 = ValueType::GetObjectType((ValueType *)((long)&func + 4));
    bVar2 = OVar4 == ObjectWithArray;
  }
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bb2,
                       "(baseOpnd->GetValueType().IsLikelyObject() && baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray)"
                       ,
                       "baseOpnd->GetValueType().IsLikelyObject() && baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (local_20 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3bb3,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  func_00 = local_20->m_func;
  bVar2 = IR::RegOpnd::IsArrayRegOpnd((RegOpnd *)insertBeforeInstr_local);
  if (bVar2) {
    this_00 = IR::RegOpnd::AsArrayRegOpnd((RegOpnd *)insertBeforeInstr_local);
    local_70 = IR::ArrayRegOpnd::CopyAsRegOpnd(this_00,func_00);
  }
  else {
    this_01 = IR::Opnd::Copy((Opnd *)insertBeforeInstr_local,func_00);
    local_70 = IR::Opnd::AsRegOpnd(this_01);
  }
  pSVar6 = StackSym::New(TyVar,func_00);
  local_70->m_sym = pSVar6;
  autoReuseArrayOpnd._20_2_ = IR::Opnd::GetValueType(&local_70->super_Opnd);
  autoReuseArrayOpnd._22_2_ = ValueType::ToArray((ValueType *)&autoReuseArrayOpnd.field_0x14);
  IR::Opnd::SetValueType(&local_70->super_Opnd,(ValueType)autoReuseArrayOpnd._22_2_);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_58,&local_70->super_Opnd,func_00,false);
  baseOpnd_00 = insertBeforeInstr_local;
  offset = Js::DynamicObject::GetOffsetOfObjectArray();
  type = IR::Opnd::GetType(&local_70->super_Opnd);
  src = IR::IndirOpnd::New((RegOpnd *)baseOpnd_00,offset,type,func_00,false);
  InsertMove(&local_70->super_Opnd,&src->super_Opnd,local_20,true);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_58);
  return local_70;
}

Assistant:

IR::RegOpnd *Lowerer::LoadObjectArray(IR::RegOpnd *const baseOpnd, IR::Instr *const insertBeforeInstr)
{
    Assert(baseOpnd);
    Assert(
        baseOpnd->GetValueType().IsLikelyObject() &&
        baseOpnd->GetValueType().GetObjectType() == ObjectType::ObjectWithArray);
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;

    // mov  array, [base + offsetOf(objectArrayOrFlags)]
    IR::RegOpnd *const arrayOpnd =
        baseOpnd->IsArrayRegOpnd() ? baseOpnd->AsArrayRegOpnd()->CopyAsRegOpnd(func) : baseOpnd->Copy(func)->AsRegOpnd();
    arrayOpnd->m_sym = StackSym::New(TyVar, func);
    arrayOpnd->SetValueType(arrayOpnd->GetValueType().ToArray());
    const IR::AutoReuseOpnd autoReuseArrayOpnd(arrayOpnd, func, false /* autoDelete */);
    InsertMove(
        arrayOpnd,
        IR::IndirOpnd::New(
            baseOpnd,
            Js::DynamicObject::GetOffsetOfObjectArray(),
            arrayOpnd->GetType(),
            func),
        insertBeforeInstr);

    return arrayOpnd;
}